

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_iq1_m(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  float *pfVar1;
  undefined8 *puVar2;
  byte bVar3;
  char cVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  void *pvVar11;
  int i;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  float *pfVar17;
  char *pcVar18;
  bool bVar19;
  float *pfVar20;
  ulong uVar21;
  ushort *puVar22;
  int i_1;
  long lVar23;
  long lVar24;
  long lVar25;
  float *pfVar26;
  byte bVar27;
  int8_t *piVar28;
  ulong uVar29;
  ulong uVar30;
  undefined *puVar31;
  ulong uVar32;
  float *xg;
  ulong uVar33;
  ulong uVar34;
  int k;
  ulong uVar35;
  int iVar36;
  ulong uVar37;
  int i_3;
  long lVar38;
  uint uVar39;
  float *pfVar40;
  float *pfVar41;
  bool bVar42;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar43;
  int iVar44;
  float fVar45;
  undefined1 auVar46 [16];
  anon_union_4_2_5fd15f10 fp32;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  uint16_t index [2];
  int8_t L [16];
  float weight [16];
  int8_t shifts [16];
  float pairs [32];
  float scales [16];
  int in_stack_fffffffffffffdb8;
  undefined1 auStack_234 [12];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [24];
  float *local_1d0;
  float *local_1c8;
  uint64_t *local_1c0;
  undefined8 local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  char local_1a8 [16];
  void *local_198;
  float *local_190;
  float *local_188;
  uint16_t *local_180;
  long local_178;
  long local_170;
  int64_t local_168;
  long local_160;
  long local_158;
  int *local_150;
  float local_148 [16];
  byte abStack_108 [16];
  undefined8 local_f8;
  int local_ec;
  float afStack_e8 [46];
  
  local_198 = dst;
  local_1d0 = src;
  local_1c8 = quant_weights;
  if ((char)n_per_row != '\0') {
    pcVar18 = "n_per_row%QK_K == 0";
    iVar44 = 0x11bf;
LAB_0013918d:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,iVar44,"GGML_ASSERT(%s) failed",pcVar18);
  }
  lVar13 = n_per_row >> 8;
  if (0 < nrow) {
    local_178 = lVar13 * 0x38;
    lVar38 = 0;
    local_168 = nrow;
    local_170 = n_per_row << 2;
    do {
      local_1c0 = iq2_data[2].grid;
      if (iq2_data[2].grid == (uint64_t *)0x0) {
        pcVar18 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar44 = 0x10d5;
        goto LAB_0013918d;
      }
      local_150 = iq2_data[2].map;
      if (iq2_data[2].map == (int *)0x0) {
        pcVar18 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar44 = 0x10d6;
        goto LAB_0013918d;
      }
      local_180 = iq2_data[2].neighbours;
      if (iq2_data[2].neighbours == (uint16_t *)0x0) {
        pcVar18 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar44 = 0x10d7;
        goto LAB_0013918d;
      }
      local_160 = lVar38;
      if (0 < lVar13) {
        local_180 = iq2_data[2].neighbours + -1;
        lVar38 = 0;
        pfVar20 = local_1c8;
        pfVar41 = local_1d0;
        do {
          pvVar11 = local_198;
          pfVar1 = local_1d0;
          lVar14 = lVar38 * 0x38;
          local_158 = lVar38;
          puVar2 = (undefined8 *)((long)local_198 + lVar14 + 0x20);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)local_198 + lVar14 + 0x10);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)local_198 + lVar14) = 0;
          ((undefined8 *)((long)local_198 + lVar14))[1] = 0;
          *(undefined8 *)((long)local_198 + lVar14 + 0x30) = 0;
          fVar50 = 0.0;
          lVar15 = 0;
          do {
            fVar50 = fVar50 + pfVar41[lVar15] * pfVar41[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x100);
          fVar50 = (fVar50 + fVar50) * 0.00390625;
          auVar46 = ZEXT816(0);
          local_188 = pfVar20;
          local_190 = pfVar41;
          lVar15 = 0;
          do {
            if (local_1c8 == (float *)0x0) {
              lVar23 = 0;
              do {
                pfVar17 = pfVar41 + lVar23;
                fVar48 = pfVar17[1];
                fVar43 = pfVar17[2];
                fVar54 = pfVar17[3];
                local_148[lVar23] = *pfVar17 * *pfVar17;
                local_148[lVar23 + 1] = fVar48 * fVar48;
                local_148[lVar23 + 2] = fVar43 * fVar43;
                local_148[lVar23 + 3] = fVar54 * fVar54;
                lVar23 = lVar23 + 4;
              } while (lVar23 != 0x10);
            }
            else {
              lVar23 = 0;
              do {
                fVar48 = pfVar20[lVar23];
                fVar43 = pfVar41[lVar23] * pfVar41[lVar23] + fVar50;
                if (fVar43 < 0.0) {
                  fVar43 = sqrtf(fVar43);
                }
                else {
                  fVar43 = SQRT(fVar43);
                }
                local_148[lVar23] = fVar48 * fVar43;
                lVar23 = lVar23 + 1;
              } while (lVar23 != 0x10);
            }
            pfVar17 = pfVar1 + lVar38 * 0x100 + lVar15 * 0x10;
            auVar49 = ZEXT416((uint)ABS(*pfVar17));
            lVar23 = 1;
            do {
              if (auVar49._0_4_ <= ABS(pfVar41[lVar23])) {
                auVar49._0_4_ = ABS(pfVar41[lVar23]);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0x10);
            fVar48 = auVar49._0_4_;
            auStack_234 = auVar46._4_12_;
            local_1b8 = lVar15;
            if (1e-07 <= fVar48) {
              lVar15 = 0;
              iVar44 = 0;
              fVar43 = 1.4013e-45;
              do {
                fVar54 = (pfVar41 + lVar15)[1];
                (&local_f8)[lVar15] = CONCAT44(iVar44,pfVar41[lVar15]);
                afStack_e8[lVar15 * 2] = fVar54;
                afStack_e8[lVar15 * 2 + 1] = fVar43;
                lVar15 = lVar15 + 2;
                iVar44 = iVar44 + 2;
                fVar43 = (float)((int)fVar43 + 2);
              } while (lVar15 != 0x10);
              qsort(&local_f8,0x10,8,iq1_sort_helper);
              uVar37 = 0xffffffff;
              uVar21 = 0xffffffffffffffff;
              lVar15 = (long)&local_f8 + 4;
              uVar30 = 0;
              fVar43 = -1.1754944e-38;
              uVar29 = 0xffffffff;
              uVar33 = 0xffffffff;
              do {
                lVar23 = 0;
                uVar32 = uVar21;
                uVar34 = uVar30;
                do {
                  fVar54 = 0.0;
                  fVar55 = 0.0;
                  local_1e8._0_16_ = (undefined1  [16])0x0;
                  local_1f8 = (undefined1  [16])0x0;
                  fVar56 = 0.0;
                  if (uVar30 == 0) {
                    fVar47 = 0.0;
                    fVar45 = 0.0;
                    fVar51 = 0.0;
                    fVar52 = 0.0;
                    fVar53 = 0.0;
                  }
                  else {
                    uVar35 = 0;
                    fVar47 = 0.0;
                    fVar45 = 0.0;
                    fVar51 = 0.0;
                    fVar52 = 0.0;
                    fVar53 = 0.0;
                    do {
                      lVar24 = (long)*(int *)((long)&local_f8 + uVar35 * 8 + 4);
                      if (lVar24 < 8) {
                        fVar64 = pfVar17[lVar24];
                        fVar57 = local_148[lVar24] * -0.875;
                        fVar59 = local_148[lVar24] * -1.125;
                        fVar63 = fVar59 * fVar64;
                        fVar61 = fVar64 * fVar57;
                        fVar62 = fVar64 * fVar59;
                        fVar64 = fVar64 * fVar57;
                        fVar58 = fVar57 * -0.875;
                        fVar60 = fVar59 * -1.125;
                      }
                      else {
                        fVar64 = pfVar17[lVar24];
                        fVar59 = local_148[lVar24] * -1.125;
                        fVar57 = local_148[lVar24] * -0.875;
                        fVar63 = fVar59 * fVar64;
                        fVar61 = fVar64 * fVar59;
                        fVar62 = fVar64 * fVar57;
                        fVar64 = fVar64 * fVar57;
                        fVar58 = fVar59 * -1.125;
                        fVar60 = fVar57 * -0.875;
                      }
                      fVar55 = fVar55 + fVar64;
                      fVar54 = fVar54 + fVar57 * -0.875;
                      fVar51 = fVar51 + fVar62;
                      fVar45 = fVar45 + fVar61;
                      fVar47 = fVar47 + fVar63;
                      fVar52 = fVar52 + fVar58;
                      fVar53 = fVar53 + fVar60;
                      fVar56 = fVar56 + fVar59 * -1.125;
                      uVar35 = uVar35 + 1;
                    } while (uVar30 != uVar35);
                    auVar7._4_4_ = fVar51;
                    auVar7._0_4_ = fVar45;
                    auVar7._8_4_ = fVar47;
                    auVar7._12_4_ = 0;
                    local_1e8._0_16_ = auVar7 << 0x20;
                    auVar8._4_4_ = fVar53;
                    auVar8._0_4_ = fVar52;
                    auVar8._8_4_ = fVar56;
                    auVar8._12_4_ = 0;
                    local_1f8 = auVar8 << 0x20;
                  }
                  if (uVar30 < uVar34) {
                    lVar24 = 0;
                    do {
                      lVar25 = (long)*(int *)(lVar15 + lVar24 * 8);
                      if (lVar25 < 8) {
                        fVar64 = pfVar17[lVar25];
                        fVar57 = local_148[lVar25] * 0.125;
                        fVar59 = local_148[lVar25] * -0.125;
                        fVar63 = fVar59 * fVar64;
                        fVar61 = fVar64 * fVar57;
                        fVar62 = fVar64 * fVar59;
                        fVar64 = fVar64 * fVar57;
                        fVar58 = fVar57 * 0.125;
                        fVar60 = fVar59 * -0.125;
                      }
                      else {
                        fVar64 = pfVar17[lVar25];
                        fVar59 = local_148[lVar25] * -0.125;
                        fVar57 = local_148[lVar25] * 0.125;
                        fVar63 = fVar59 * fVar64;
                        fVar61 = fVar64 * fVar59;
                        fVar62 = fVar64 * fVar57;
                        fVar64 = fVar64 * fVar57;
                        fVar58 = fVar59 * -0.125;
                        fVar60 = fVar57 * 0.125;
                      }
                      fVar55 = fVar55 + fVar64;
                      fVar54 = fVar54 + fVar57 * 0.125;
                      fVar51 = fVar51 + fVar62;
                      fVar45 = fVar45 + fVar61;
                      fVar47 = fVar47 + fVar63;
                      fVar52 = fVar52 + fVar58;
                      fVar53 = fVar53 + fVar60;
                      fVar56 = fVar56 + fVar59 * -0.125;
                      lVar24 = lVar24 + 1;
                    } while (lVar23 != lVar24);
                    auVar9._4_4_ = fVar51;
                    auVar9._0_4_ = fVar45;
                    auVar9._8_4_ = fVar47;
                    auVar9._12_4_ = 0;
                    local_1e8._0_16_ = auVar9 << 0x20;
                    auVar10._4_4_ = fVar53;
                    auVar10._0_4_ = fVar52;
                    auVar10._8_4_ = fVar56;
                    auVar10._12_4_ = 0;
                    local_1f8 = auVar10 << 0x20;
                  }
                  uVar35 = uVar32;
                  if (uVar34 < 0x10) {
                    do {
                      lVar24 = (long)(&local_ec)[uVar35 * 2];
                      if (lVar24 < 8) {
                        fVar64 = pfVar17[lVar24];
                        fVar57 = local_148[lVar24] * 1.125;
                        fVar59 = local_148[lVar24] * 0.875;
                        fVar63 = fVar59 * fVar64;
                        fVar61 = fVar64 * fVar57;
                        fVar62 = fVar64 * fVar59;
                        fVar64 = fVar64 * fVar57;
                        fVar58 = fVar57 * 1.125;
                        fVar60 = fVar59 * 0.875;
                      }
                      else {
                        fVar64 = pfVar17[lVar24];
                        fVar59 = local_148[lVar24] * 0.875;
                        fVar57 = local_148[lVar24] * 1.125;
                        fVar63 = fVar59 * fVar64;
                        fVar61 = fVar64 * fVar59;
                        fVar62 = fVar64 * fVar57;
                        fVar64 = fVar64 * fVar57;
                        fVar58 = fVar59 * 0.875;
                        fVar60 = fVar57 * 1.125;
                      }
                      fVar55 = fVar55 + fVar64;
                      fVar54 = fVar54 + fVar57 * 1.125;
                      fVar51 = fVar51 + fVar62;
                      fVar45 = fVar45 + fVar61;
                      fVar47 = fVar47 + fVar63;
                      fVar52 = fVar52 + fVar58;
                      fVar53 = fVar53 + fVar60;
                      fVar56 = fVar56 + fVar59 * 0.875;
                      uVar35 = uVar35 + 1;
                    } while (uVar35 < 0xf);
                    auVar5._4_4_ = fVar51;
                    auVar5._0_4_ = fVar45;
                    auVar5._8_4_ = local_1e8._12_4_;
                    local_1e8._0_12_ = auVar5 << 0x20;
                    local_1e8._12_4_ = fVar47;
                    auVar6._4_4_ = fVar53;
                    auVar6._0_4_ = fVar52;
                    auVar6._8_4_ = local_1f8._12_4_;
                    local_1f8._0_12_ = auVar6 << 0x20;
                    local_1f8._12_4_ = fVar56;
                  }
                  local_1e8._0_4_ = fVar55;
                  local_1f8._0_4_ = fVar54;
                  uVar35 = 0;
                  do {
                    fVar54 = *(float *)(local_1f8 + uVar35 * 4);
                    if ((0.0 < fVar54) &&
                       (fVar55 = *(float *)(local_1e8 + uVar35 * 4),
                       fVar43 * fVar54 < fVar55 * fVar55)) {
                      fVar48 = fVar55 / fVar54;
                      fVar43 = fVar55 * fVar48;
                      uVar33 = uVar30 & 0xffffffff;
                      uVar29 = uVar34 & 0xffffffff;
                      uVar37 = uVar35 & 0xffffffff;
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar35 != 4);
                  uVar34 = uVar34 + 1;
                  lVar23 = lVar23 + 1;
                  uVar32 = uVar32 + 1;
                } while (uVar34 != 0x11);
                uVar30 = uVar30 + 1;
                lVar15 = lVar15 + 8;
                uVar21 = uVar21 + 1;
              } while (uVar30 != 0x11);
              iVar44 = (int)uVar33;
              if (((iVar44 < 0) || (iVar12 = (int)uVar29, iVar12 < 0)) ||
                 (iVar36 = (int)uVar37, iVar36 < 0)) {
                pcVar18 = "besti1 >= 0 && besti2 >= 0 && best_k >= 0";
                iVar44 = 0x1165;
                goto LAB_0013918d;
              }
              if (iVar44 != 0) {
                uVar21 = 0;
                do {
                  local_1a8[*(int *)((long)&local_f8 + uVar21 * 8 + 4)] = '\0';
                  uVar21 = uVar21 + 1;
                } while (uVar33 != uVar21);
              }
              if (iVar44 < iVar12) {
                piVar16 = (int *)((long)&local_f8 + uVar33 * 8 + 4);
                do {
                  local_1a8[*piVar16] = '\x01';
                  uVar39 = (int)uVar33 + 1;
                  uVar33 = (ulong)uVar39;
                  piVar16 = piVar16 + 2;
                } while ((int)uVar39 < iVar12);
              }
              if (iVar12 < 0x10) {
                iVar12 = iVar12 + -1;
                piVar16 = (int *)((long)&local_f8 + uVar29 * 8 + 4);
                do {
                  local_1a8[*piVar16] = '\x02';
                  iVar12 = iVar12 + 1;
                  piVar16 = piVar16 + 2;
                } while (iVar12 < 0xf);
              }
              if (0.0 <= fVar48) {
                pfVar26 = (float *)&DAT_0015953c;
                pfVar40 = (float *)&DAT_0015953c;
                if ((uVar37 & 1) == 0) {
                  pfVar40 = (float *)&DAT_00159530;
                }
                if (iVar36 < 2) {
                  pfVar26 = (float *)&DAT_00159530;
                }
              }
              else {
                local_1a8[1] = '\x02' - local_1a8[1];
                local_1a8[0] = '\x02' - local_1a8[0];
                local_1a8[2] = '\x02' - local_1a8[2];
                local_1a8[3] = '\x02' - local_1a8[3];
                local_1a8[4] = '\x02' - local_1a8[4];
                local_1a8[5] = '\x02' - local_1a8[5];
                local_1a8[6] = '\x02' - local_1a8[6];
                local_1a8[7] = '\x02' - local_1a8[7];
                local_1a8[9] = '\x02' - local_1a8[9];
                local_1a8[8] = '\x02' - local_1a8[8];
                local_1a8[10] = '\x02' - local_1a8[10];
                local_1a8[0xb] = '\x02' - local_1a8[0xb];
                local_1a8[0xc] = '\x02' - local_1a8[0xc];
                local_1a8[0xd] = '\x02' - local_1a8[0xd];
                local_1a8[0xe] = '\x02' - local_1a8[0xe];
                local_1a8[0xf] = '\x02' - local_1a8[0xf];
                fVar48 = -fVar48;
                if (iVar36 == 0) {
                  uVar37 = 3;
                }
                else {
                  if (iVar36 != 1) {
                    pfVar40 = (float *)&DAT_00159530;
                    if (iVar36 == 2) {
                      pfVar40 = (float *)&DAT_0015953c;
                    }
                    uVar37 = (ulong)(iVar36 == 2);
                    pfVar26 = (float *)&DAT_00159530;
                    goto LAB_00138b42;
                  }
                  uVar37 = 2;
                }
                pfVar26 = (float *)&DAT_0015953c;
                pfVar40 = (float *)&DAT_0015953c;
                if ((uVar37 & 1) == 0) {
                  pfVar40 = (float *)&DAT_00159530;
                }
              }
LAB_00138b42:
              bVar19 = true;
              lVar15 = 0;
              do {
                while( true ) {
                  lVar23 = 0;
                  uVar29 = 0;
                  piVar28 = local_1a8 + lVar15 * 8;
                  do {
                    uVar29 = (ulong)((uint)uVar29 | (int)*piVar28 << ((byte)lVar23 & 0x1f));
                    lVar23 = lVar23 + 2;
                    piVar28 = piVar28 + 1;
                  } while (lVar23 != 0x10);
                  iVar44 = local_150[uVar29 & 0xffff];
                  if ((long)iVar44 < 0) break;
                  *(short *)(&stack0xfffffffffffffdb8 + lVar15 * 2) = (short)iVar44;
                  bVar42 = lVar15 != 0;
                  lVar15 = 1;
                  if (bVar42) {
                    if (bVar19) goto LAB_00138cf8;
                    goto LAB_00138c22;
                  }
                }
                xg = pfVar40;
                if (lVar15 == 0) {
                  xg = pfVar26;
                }
                iVar44 = iq1_find_best_neighbour2
                                   (local_180 + -(long)iVar44,local_1c0,pfVar17 + lVar15 * 8,
                                    local_148 + lVar15 * 8,fVar48,xg,local_1a8 + lVar15 * 8,
                                    in_stack_fffffffffffffdb8);
                bVar19 = false;
                *(short *)(&stack0xfffffffffffffdb8 + lVar15 * 2) = (short)iVar44;
                bVar42 = lVar15 == 0;
                lVar15 = 1;
              } while (bVar42);
LAB_00138c22:
              fVar43 = 0.0;
              fVar54 = 0.0;
              lVar15 = 0;
              puVar22 = (ushort *)&stack0xfffffffffffffdb8;
              bVar19 = true;
              do {
                bVar42 = bVar19;
                pfVar17 = pfVar40;
                if (bVar42) {
                  pfVar17 = pfVar26;
                }
                lVar23 = 0;
                do {
                  cVar4 = *(char *)((long)local_1c0 + lVar23 + (ulong)*puVar22 * 8);
                  fVar55 = local_148[lVar15 + lVar23] *
                           pfVar17[(short)((uint)(int)(short)((short)cVar4 +
                                                              (short)(((int)cVar4 - 1U & 0xffff) >>
                                                                     0xf) + -1) >> 1)];
                  fVar43 = fVar43 + pfVar17[(short)((uint)(int)(short)((short)cVar4 +
                                                                       (short)(((int)cVar4 - 1U &
                                                                               0xffff) >> 0xf) + -1)
                                                   >> 1)] * fVar55;
                  fVar54 = fVar54 + pfVar41[lVar15 + lVar23] * fVar55;
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 8);
                lVar15 = 8;
                puVar22 = (ushort *)&stack0xfffffffffffffdba;
                bVar19 = false;
              } while (bVar42);
              if (0.0 < fVar54 && 0.0 < fVar43) {
                fVar48 = fVar54 / fVar43;
              }
LAB_00138cf8:
              *(char *)((long)pvVar11 + local_1b8 * 2 + lVar14) = (char)in_stack_fffffffffffffdb8;
              *(char *)((long)pvVar11 + local_1b8 * 2 + lVar14 + 1) =
                   (char)((uint)in_stack_fffffffffffffdb8 >> 0x10);
              *(byte *)((long)pvVar11 + local_1b8 + lVar14 + 0x20) =
                   (byte)(ushort)((uint)in_stack_fffffffffffffdb8 >> 0x14) & 0xf0 |
                   (byte)((uint)in_stack_fffffffffffffdb8 >> 8);
              if (fVar48 < 0.0) {
                pcVar18 = "scale >= 0";
                iVar44 = 0x118f;
                goto LAB_0013918d;
              }
              afStack_e8[local_1b8 + 0x1c] = fVar48;
              abStack_108[local_1b8] = (byte)uVar37;
              if (auVar46._0_4_ <= fVar48) {
                auVar46._4_12_ = auStack_234;
                auVar46._0_4_ = fVar48;
              }
            }
            else {
              afStack_e8[lVar15 + 0x1c] = 0.0;
              builtin_strncpy(local_1a8,
                              "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                              0x10);
            }
            lVar15 = local_1b8 + 1;
            pfVar41 = pfVar41 + 0x10;
            pfVar20 = pfVar20 + 0x10;
          } while (lVar15 != 0x10);
          fVar48 = auVar46._0_4_;
          if ((fVar48 != 0.0) || (NAN(fVar48))) {
            fVar43 = 0.0;
            fVar54 = 0.0;
            fVar55 = 0.0;
            fVar56 = 0.0;
            uVar29 = 0;
            pfVar20 = local_190;
            pfVar41 = local_188;
            do {
              uVar39 = (uint)((afStack_e8[uVar29 + 0x1c] * (1.0 / (fVar48 / 15.0)) + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
              if (0x400006 < uVar39) {
                uVar39 = 0x400007;
              }
              if (uVar39 < 0x400001) {
                uVar39 = 0x400000;
              }
              puVar22 = (ushort *)((long)pvVar11 + (uVar29 >> 2 & 0x3fffffff) * 2 + lVar14 + 0x30);
              *puVar22 = *puVar22 | (ushort)(uVar39 << ((byte)uVar29 & 3) * '\x03');
              bVar3 = abStack_108[uVar29];
              bVar27 = *(byte *)((long)pvVar11 + uVar29 + lVar14 + 0x20) |
                       (&DAT_0014ebc4)[(char)bVar3];
              *(byte *)((long)pvVar11 + uVar29 + lVar14 + 0x20) = bVar27;
              if (local_1c8 == (float *)0x0) {
                lVar38 = 0;
                do {
                  pfVar1 = pfVar20 + lVar38;
                  fVar47 = pfVar1[1];
                  fVar45 = pfVar1[2];
                  fVar51 = pfVar1[3];
                  local_148[lVar38] = *pfVar1 * *pfVar1;
                  local_148[lVar38 + 1] = fVar47 * fVar47;
                  local_148[lVar38 + 2] = fVar45 * fVar45;
                  local_148[lVar38 + 3] = fVar51 * fVar51;
                  lVar38 = lVar38 + 4;
                } while (lVar38 != 0x10);
              }
              else {
                lVar38 = 0;
                local_1b8 = CONCAT44(fVar54,fVar43);
                fStack_1b0 = fVar55;
                fStack_1ac = fVar56;
                do {
                  fVar47 = pfVar41[lVar38];
                  fVar45 = pfVar20[lVar38] * pfVar20[lVar38] + fVar50;
                  if (fVar45 < 0.0) {
                    fVar45 = sqrtf(fVar45);
                    fVar43 = (float)local_1b8;
                    fVar54 = local_1b8._4_4_;
                    fVar55 = fStack_1b0;
                    fVar56 = fStack_1ac;
                  }
                  else {
                    fVar45 = SQRT(fVar45);
                  }
                  local_148[lVar38] = fVar47 * fVar45;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 0x10);
              }
              uVar33 = 0;
              bVar19 = true;
              do {
                bVar42 = bVar19;
                bVar19 = (bVar3 & 1) == 0;
                if (bVar42) {
                  bVar19 = (char)bVar3 < '\x02';
                }
                puVar31 = &DAT_0015953c;
                if (bVar19) {
                  puVar31 = &DAT_00159530;
                }
                lVar38 = 0;
                do {
                  cVar4 = *(char *)((long)local_1c0 +
                                   lVar38 + (ulong)((uint)bVar27 << ((char)uVar33 * -4 + 8U & 0x1f)
                                                   & 0x700) * 8 +
                                            (ulong)*(byte *)((long)pvVar11 +
                                                            (uVar33 | uVar29 * 2) + lVar14) * 8);
                  fVar47 = *(float *)(puVar31 +
                                     (long)(short)((uint)(int)(short)((short)cVar4 +
                                                                      (short)(((int)cVar4 - 1U &
                                                                              0xffff) >> 0xf) + -1)
                                                  >> 1) * 4) * (float)(int)(uVar39 * 2 + -0x7fffff);
                  fVar45 = local_148[uVar33 * 8 + lVar38] * fVar47;
                  fVar43 = fVar43 + fVar47 * fVar45;
                  fVar54 = fVar54 + pfVar20[uVar33 * 8 + lVar38] * fVar45;
                  fVar55 = fVar55 + fVar45 * 0.0;
                  fVar56 = fVar56 + fVar45 * 0.0;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 8);
                uVar33 = 1;
                bVar19 = false;
              } while (bVar42);
              uVar29 = uVar29 + 1;
              pfVar20 = pfVar20 + 0x10;
              pfVar41 = pfVar41 + 0x10;
            } while (uVar29 != 0x10);
            fVar48 = (float)(~-(uint)(0.0 < fVar43) & (uint)(fVar48 / 15.0) |
                            (uint)(fVar54 / fVar43) & -(uint)(0.0 < fVar43)) * 1.1125;
            fVar50 = (float)(((uint)fVar48 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar48 * 2) < 0x71000000) {
              fVar50 = 2.0;
            }
            fVar50 = fVar50 + ABS(fVar48) * 5.192297e+33 * 7.70372e-34;
            uVar39 = ((uint)fVar50 & 0xfff) + ((uint)fVar50 >> 0xd & 0x7c00);
            if (0xff000000 < (uint)((int)fVar48 * 2)) {
              uVar39 = 0x7e00;
            }
            *(uint *)((long)pvVar11 + lVar14 + 0x30) =
                 (uVar39 & 0xf) << 0xc | (uint)((ushort)(uVar39 << 8) & 0xf000) << 0x10 |
                 *(uint *)((long)pvVar11 + lVar14 + 0x30);
            *(uint *)((long)pvVar11 + lVar14 + 0x34) =
                 *(uint *)((long)pvVar11 + lVar14 + 0x34) |
                 ((uVar39 & 0xfff) << 4 | ((uint)fVar48 >> 0x10 & 0x8000 | uVar39) << 0x10) &
                 (uint)DAT_0014eaf0;
          }
          lVar38 = local_158 + 1;
          pfVar41 = local_190 + 0x100;
          pfVar20 = local_188 + 0x100;
        } while (lVar38 != lVar13);
      }
      local_1d0 = (float *)((long)local_1d0 + local_170);
      local_198 = (void *)((long)local_198 + local_178);
      lVar38 = local_160 + 1;
      nrow = local_168;
    } while (lVar38 != local_168);
  }
  return nrow * lVar13 * 0x38;
}

Assistant:

size_t quantize_iq1_m(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    float  scales[QK_K/IQ1M_BLOCK_SIZE];
    float  weight[IQ1M_BLOCK_SIZE];
    int8_t L[IQ1M_BLOCK_SIZE];
    float  pairs[2*IQ1M_BLOCK_SIZE];
    uint16_t index[IQ1M_BLOCK_SIZE/8];
    int8_t shifts[QK_K/IQ1M_BLOCK_SIZE];
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq1_m_impl(src, qrow, n_per_row, quant_weights, scales, weight, pairs, L, index, shifts);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq1_m);
    }
    return nrow * nblock * sizeof(block_iq1_m);
}